

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePiece.cc
# Opt level: O0

vector<onmt::Token,_std::allocator<onmt::Token>_> * __thiscall
onmt::SentencePiece::encode_and_annotate(SentencePiece *this,Token *token,bool training)

{
  bool bVar1;
  Token *this_00;
  Token *pTVar2;
  reference pvVar3;
  reference pvVar4;
  byte in_CL;
  size_type in_RDX;
  long *in_RSI;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_RDI;
  value_type *last;
  value_type *first;
  Token sub_token_1;
  Token sub_token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *piece;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool apply_spacer_on_next;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens;
  string *in_stack_fffffffffffffe68;
  Token *in_stack_fffffffffffffe70;
  Token *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *this_01;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *this_02;
  string local_148 [2];
  undefined1 local_100;
  undefined1 local_fe;
  undefined1 local_fd;
  string local_e0 [8];
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_stack_ffffffffffffff28;
  Token *in_stack_ffffffffffffff30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  undefined1 *local_60;
  byte local_52;
  undefined1 local_51;
  undefined4 local_50;
  undefined1 local_39 [32];
  byte local_19;
  size_type local_18;
  
  local_19 = in_CL & 1;
  this_02 = in_RDI;
  local_18 = in_RDX;
  (**(code **)(*in_RSI + 0x30))(local_39 + 1,in_RSI,in_RDX,local_19);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  if (bVar1) {
    this_01 = (vector<onmt::Token,_std::allocator<onmt::Token>_> *)local_39;
    std::allocator<onmt::Token>::allocator((allocator<onmt::Token> *)0x3baea4);
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::vector
              (this_01,local_18,
               (value_type *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (allocator_type *)in_stack_fffffffffffffe78);
    std::allocator<onmt::Token>::~allocator((allocator<onmt::Token> *)0x3baecc);
  }
  else {
    local_51 = 0;
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::vector
              ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)0x3baf14);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_39 + 1));
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve(this_02,(size_type)in_RDI);
    local_52 = 0;
    local_60 = local_39 + 1;
    local_68._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffe68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe68), bVar1) {
      this_00 = (Token *)__gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_68);
      in_stack_fffffffffffffe87 =
           starts_with((string *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                       &in_stack_fffffffffffffe78->surface);
      if ((bool)in_stack_fffffffffffffe87) {
        in_stack_fffffffffffffe78 = (Token *)std::__cxx11::string::length();
        pTVar2 = (Token *)std::__cxx11::string::length();
        if (in_stack_fffffffffffffe78 == pTVar2) {
          local_52 = 1;
          this_00 = in_stack_fffffffffffffe70;
        }
        else {
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_e0,(ulong)this_00);
          Token::Token(this_00,in_stack_fffffffffffffe68);
          std::__cxx11::string::~string(local_e0);
          std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                    ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                     CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
          Token::~Token(this_00);
        }
      }
      else {
        in_stack_fffffffffffffe68 = local_148;
        std::__cxx11::string::string((string *)in_stack_fffffffffffffe68,(string *)this_00);
        Token::Token(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        std::__cxx11::string::~string((string *)local_148);
        if ((local_52 & 1) == 0) {
          bVar1 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::empty
                            ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
          if (!bVar1) {
            local_100 = 1;
          }
        }
        else {
          local_fe = 1;
          local_fd = 1;
          local_52 = 0;
        }
        std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                  ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                   CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78);
        Token::~Token(in_stack_fffffffffffffe70);
        this_00 = in_stack_fffffffffffffe70;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_68);
      in_stack_fffffffffffffe70 = this_00;
    }
    pvVar3 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::front
                       ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                        in_stack_fffffffffffffe70);
    pvVar4 = std::vector<onmt::Token,_std::allocator<onmt::Token>_>::back
                       ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                        in_stack_fffffffffffffe70);
    pvVar3->join_left = (bool)(*(byte *)(local_18 + 0x28) & 1);
    pvVar4->join_right = (bool)(*(byte *)(local_18 + 0x29) & 1);
    if (((*(byte *)(local_18 + 0x28) & 1) != 0) && ((*(byte *)(local_18 + 0x2b) & 1) != 0)) {
      pvVar3->preserve = true;
    }
    if (((*(byte *)(local_18 + 0x29) & 1) != 0) && ((*(byte *)(local_18 + 0x2b) & 1) != 0)) {
      pvVar4->preserve = true;
    }
    SubwordEncoder::propagate_token_properties(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_51 = 1;
  }
  local_50 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  return this_02;
}

Assistant:

std::vector<Token> SentencePiece::encode_and_annotate(const Token& token, bool training) const
  {
    std::vector<std::string> pieces = encode(token.surface, training);

    // SentencePiece sometimes returns no pieces for a non empty input. In this case
    // we simply return the original token.
    if (pieces.empty())
      return std::vector<Token>(1, token);

    std::vector<Token> tokens;
    tokens.reserve(pieces.size());
    bool apply_spacer_on_next = false;

    for (auto& piece : pieces)
    {
      // Prefixed by the spacer.
      if (starts_with(piece, sp_marker))
      {
        if (piece.length() == sp_marker.length())  // Piece is just the spacer.
        {
          // Skip this isolated spacer and mark the next piece with the spacer flag.
          apply_spacer_on_next = true;
          continue;
        }
        else
        {
          Token sub_token(piece.substr(sp_marker.length()));
          sub_token.spacer = true;
          tokens.emplace_back(std::move(sub_token));
        }
      }
      else
      {
        Token sub_token(std::move(piece));
        if (apply_spacer_on_next)
        {
          sub_token.spacer = true;
          sub_token.preserve = true;  // The spacer was not attached to this piece so preserve it.
          apply_spacer_on_next = false;
        }
        else if (!tokens.empty())
        {
          sub_token.join_left = true;  // No spacer means it should be joined with the previous subtoken.
        }
        tokens.emplace_back(std::move(sub_token));
      }
    }

    auto& first = tokens.front();
    auto& last = tokens.back();
    first.join_left = token.join_left;
    last.join_right = token.join_right;
    if (token.join_left && token.preserve)
      first.preserve = true;
    if (token.join_right && token.preserve)
      last.preserve = true;

    propagate_token_properties(token, tokens);
    return tokens;
  }